

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall cmFindPackageCommand::HandlePackageMode(cmFindPackageCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  pointer pCVar4;
  pointer pbVar5;
  size_type sVar6;
  cmFindPackageCommand *pcVar7;
  bool bVar8;
  bool bVar9;
  char *pcVar10;
  ostream *poVar11;
  char *__s;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  string consideredVersionsVar;
  string foundVar;
  string consideredConfigFiles;
  string notFoundMessage;
  string notFoundMessageVar;
  string consideredVersions;
  string upperFound;
  string upperDir;
  string fileVar;
  string consideredConfigsVar;
  bool local_498;
  byte local_494;
  string local_490;
  cmFindPackageCommand *local_470;
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *local_468;
  string local_460;
  string local_440;
  char *local_420;
  char *local_418;
  char local_410;
  undefined7 uStack_40f;
  string local_400;
  char *local_3e0;
  undefined8 local_3d8;
  char local_3d0;
  undefined7 uStack_3cf;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_468 = &this->ConsideredConfigs;
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::_M_erase_at_end(local_468,
                    (this->ConsideredConfigs).
                    super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::UpperCase(&local_340,&this->Name);
  cmsys::SystemTools::UpperCase(&local_360,&this->Name);
  std::__cxx11::string::append((char *)&local_340);
  std::__cxx11::string::append((char *)&local_360);
  pcVar10 = cmMakefile::GetDefinition
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
  local_470 = this;
  if (this->UseConfigFiles == true) {
    bVar8 = cmSystemTools::IsOff(pcVar10);
    if (bVar8) {
      bVar8 = false;
    }
    else {
      std::__cxx11::string::string((string *)local_320,pcVar10,(allocator *)local_1a8);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_320);
      bVar8 = cmsys::SystemTools::FileIsFullPath((char *)local_320._0_8_);
      if (!bVar8) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320);
        std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
        pcVar7 = local_470;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
        pcVar10 = cmMakefile::GetCurrentSourceDirectory
                            ((pcVar7->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,pcVar10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320);
        std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
      }
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = local_1a8 + 0x10;
      bVar8 = FindConfigFile(local_470,(string *)local_320,(string *)local_1a8);
      if (bVar8) {
        std::__cxx11::string::_M_assign((string *)&local_470->FileFound);
      }
      pcVar10 = cmMakefile::GetDefinition
                          ((local_470->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable)
      ;
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      this = local_470;
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
    }
    bVar9 = cmSystemTools::IsOff(pcVar10);
    if ((bVar9) || (bVar8 == false)) {
      bVar8 = FindConfig(this);
    }
    if ((bVar8 != false) && ((this->FileFound)._M_string_length == 0)) {
      pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      local_320._0_8_ = local_320 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_320,"fileFound is true but FileFound is empty!","");
      cmMakefile::IssueMessage(pcVar2,INTERNAL_ERROR,(string *)local_320,false);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      bVar8 = false;
      this = local_470;
    }
  }
  else {
    bVar8 = false;
  }
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_460);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_400);
  local_420 = &local_410;
  local_418 = (char *)0x0;
  local_410 = '\0';
  local_494 = 1;
  if (bVar8 == false) {
    bVar8 = false;
    local_498 = true;
  }
  else {
    bVar8 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_460);
    if ((bVar8) &&
       (bVar8 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_460),
       !bVar8)) {
      cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_460);
    }
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_400);
    StoreVersionFound(this);
    bVar8 = ReadListFile(this,(this->FileFound)._M_dataplus._M_p,DoPolicyScope);
    if (bVar8) {
      bVar8 = cmMakefile::IsDefinitionSet
                        ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_460);
      if ((bVar8) &&
         (bVar8 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_460),
         !bVar8)) {
        __s = cmMakefile::GetSafeDefinition
                        ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_400);
        pcVar10 = local_418;
        strlen(__s);
        local_498 = true;
        std::__cxx11::string::_M_replace((ulong)&local_420,0,pcVar10,(ulong)__s);
        local_494 = 1;
        bVar8 = true;
        goto LAB_0036927e;
      }
      local_498 = true;
      local_494 = 0;
    }
    else {
      local_498 = false;
      local_494 = 1;
    }
    bVar8 = false;
  }
LAB_0036927e:
  if (((local_498 & local_494) == 1) && ((this->Quiet != true || (this->Required == true)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    if (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"Found package configuration file:\n  ",0x24);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(this->FileFound)._M_dataplus._M_p,
                           (this->FileFound)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nbut it set ",0xc);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_460._M_dataplus._M_p,local_460._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," to FALSE so package \"",0x16);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"\" is considered to be NOT FOUND.",0x20);
      if (local_418 != (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320," Reason given by package: \n",0x1b);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,local_420,(long)local_418);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      }
    }
    else if ((this->ConsideredConfigs).
             super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->ConsideredConfigs).
             super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_490.field_2;
      local_490._M_string_length = 0;
      local_490.field_2._M_local_buf[0] = '\0';
      local_490._M_dataplus._M_p = (pointer)paVar1;
      if ((this->Version)._M_string_length != 0) {
        std::__cxx11::string::_M_replace((ulong)&local_490,0,(char *)0x0,0x51c8e4);
        std::__cxx11::string::_M_append((char *)&local_490,(ulong)(this->Version)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_490);
      }
      if (this->UseConfigFiles == true) {
        if (this->UseFindModules == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"By not providing \"Find",0x16);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,
                     ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                     ,0x6c);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\", but CMake did not find one.\n",0x1f);
        }
        if ((long)(this->Configs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->Configs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"Could not find a package configuration file named \"",
                     0x33);
          pbVar5 = (this->Configs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(pbVar5->_M_dataplus)._M_p,
                               pbVar5->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" provided by package \"",0x17);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_490._M_dataplus._M_p,local_490._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,
                     "Could not find a package configuration file provided by \"",0x39);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_490._M_dataplus._M_p,local_490._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," with any of the following names:\n",0x22);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"  ","");
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"");
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"\n","");
          cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&local_440,&local_3c0,&this->Configs,&local_380,&local_3a0);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_440._M_dataplus._M_p,local_440._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,
                            CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                                     local_440.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,"Add the installation prefix of \"",0x20);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                             (this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\" to CMAKE_PREFIX_PATH or set \"",0x1f);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(this->Variable)._M_dataplus._M_p,
                             (this->Variable)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\" to a directory containing one of the above files. If \"",0x38);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
        lVar14 = 0x50;
        pcVar10 = 
        "\" provides a separate development package or SDK, be sure it has been installed.";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"No \"Find",8);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                             (this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,".cmake\" found in ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"CMAKE_MODULE_PATH.",0x12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Find",4);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                             (this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,
                   ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                   ,0x186);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
        lVar14 = 0xc9;
        pcVar10 = 
        ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
        ;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,lVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != paVar1) {
        operator_delete(local_490._M_dataplus._M_p,
                        CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                                 local_490.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"Could not find a configuration file for package \"",0x31);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                           (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" that ",7);
      pcVar10 = "is compatible with";
      if ((ulong)this->VersionExact != 0) {
        pcVar10 = "exactly matches";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,pcVar10,((ulong)this->VersionExact ^ 1) * 3 + 0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," requested version \"",0x14);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(this->Version)._M_dataplus._M_p,(this->Version)._M_string_length
                          );
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"The following configuration files were considered but not accepted:\n",
                 0x44);
      if ((this->ConsideredConfigs).
          super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->ConsideredConfigs).
          super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar14 = 0;
        uVar13 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"  ",2);
          pCVar4 = (local_468->
                   super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,
                               *(char **)((long)&(pCVar4->filename)._M_dataplus._M_p + lVar14),
                               *(long *)((long)&(pCVar4->filename)._M_string_length + lVar14));
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,", version: ",0xb);
          pCVar4 = (local_468->
                   super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)((long)&(pCVar4->version)._M_dataplus._M_p + lVar14
                                                 ),
                               *(long *)((long)&(pCVar4->version)._M_string_length + lVar14));
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x40;
        } while (uVar13 < (ulong)((long)(this->ConsideredConfigs).
                                        super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->ConsideredConfigs).
                                        super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 6));
      }
    }
    pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    bVar8 = this->Required;
    std::__cxx11::stringbuf::str();
    bVar12 = bVar8 ^ 1;
    cmMakefile::IssueMessage(pcVar2,(uint)bVar12 + (uint)bVar12 * 2 + FATAL_ERROR,&local_490,false);
    paVar1 = &local_490.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != paVar1) {
      operator_delete(local_490._M_dataplus._M_p,
                      CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                               local_490.field_2._M_local_buf[0]) + 1);
    }
    if (this->Required == true) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    std::__cxx11::stringbuf::str();
    sVar6 = local_490._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != paVar1) {
      operator_delete(local_490._M_dataplus._M_p,
                      CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                               local_490.field_2._M_local_buf[0]) + 1);
    }
    if (sVar6 != 0) {
      pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_490,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != paVar1) {
        operator_delete(local_490._M_dataplus._M_p,
                        CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                                 local_490.field_2._M_local_buf[0]) + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
  }
  pcVar10 = "1";
  if (local_494 != 0) {
    pcVar10 = "0";
  }
  cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_460,pcVar10);
  local_320._0_8_ = local_320 + 0x10;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_320,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append(local_320);
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  if (local_494 == 0) {
    cmMakefile::AddDefinition(pcVar2,(string *)local_320,(this->FileFound)._M_dataplus._M_p);
  }
  else {
    cmMakefile::RemoveDefinition(pcVar2,(string *)local_320);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append(local_1a8);
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_490,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_490);
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  local_440._M_string_length = 0;
  local_440.field_2._M_local_buf[0] = '\0';
  local_3e0 = &local_3d0;
  local_3d8 = 0;
  local_3d0 = '\0';
  if ((this->ConsideredConfigs).
      super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->ConsideredConfigs).
      super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar14 = 0;
    uVar13 = 0;
    do {
      std::__cxx11::string::append((char *)&local_440);
      std::__cxx11::string::append((char *)&local_3e0);
      std::__cxx11::string::_M_append
                ((char *)&local_440,
                 *(ulong *)((long)&(((local_468->
                                     super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->filename).
                                   _M_dataplus._M_p + lVar14));
      std::__cxx11::string::_M_append
                ((char *)&local_3e0,
                 *(ulong *)((long)&(((local_468->
                                     super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->version).
                                   _M_dataplus._M_p + lVar14));
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x40;
    } while (uVar13 < (ulong)((long)(local_470->ConsideredConfigs).
                                    super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_470->ConsideredConfigs).
                                    super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  pcVar7 = local_470;
  cmMakefile::AddDefinition
            ((local_470->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_1a8,
             local_440._M_dataplus._M_p);
  cmMakefile::AddDefinition
            ((pcVar7->super_cmFindCommon).super_cmCommand.Makefile,&local_490,local_3e0);
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,CONCAT71(uStack_3cf,local_3d0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,
                    CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                             local_440.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,
                    CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                             local_490.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  return local_498;
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode()
{
  this->ConsideredConfigs.clear();

  // Support old capitalization behavior.
  std::string upperDir = cmSystemTools::UpperCase(this->Name);
  std::string upperFound = cmSystemTools::UpperCase(this->Name);
  upperDir += "_DIR";
  upperFound += "_FOUND";

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles)
    {
    if(!cmSystemTools::IsOff(def))
      {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if(!cmSystemTools::FileIsFullPath(dir.c_str()))
        {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
        }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file))
        {
        this->FileFound = file;
        fileFound = true;
        }
      def = this->Makefile->GetDefinition(this->Variable);
      }

    // Search for the config file if it is not already found.
    if(cmSystemTools::IsOff(def) || !fileFound)
      {
      fileFound = this->FindConfig();
      }

    // Sanity check.
    if(fileFound && this->FileFound.empty())
      {
      this->Makefile->IssueMessage(
        cmake::INTERNAL_ERROR, "fileFound is true but FileFound is empty!");
      fileFound = false;
      }
    }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if(fileFound)
    {
    if ((this->Makefile->IsDefinitionSet(foundVar))
      && (this->Makefile->IsOn(foundVar) == false))
      {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
      }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if(this->ReadListFile(this->FileFound.c_str(), DoPolicyScope))
      {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if ((this->Makefile->IsDefinitionSet(foundVar))
           && (this->Makefile->IsOn(foundVar) == false))
        {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage = this->Makefile->GetSafeDefinition(
                                                   notFoundMessageVar);
        }
      }
    else
      {
      // The configuration file is invalid.
      result = false;
      }
    }

  if (result && !found && (!this->Quiet || this->Required))
    {
    // The variable is not set.
    std::ostringstream e;
    std::ostringstream aw;
    if (configFileSetFOUNDFalse)
      {
      e << "Found package configuration file:\n"
        "  " << this->FileFound << "\n"
        "but it set " << foundVar << " to FALSE so package \"" <<
        this->Name << "\" is considered to be NOT FOUND.";
      if (!notFoundMessage.empty())
        {
        e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
    // If there are files in ConsideredConfigs, it means that FooConfig.cmake
    // have been found, but they didn't have appropriate versions.
    else if (!this->ConsideredConfigs.empty())
      {
      e << "Could not find a configuration file for package \""
        << this->Name << "\" that "
        << (this->VersionExact? "exactly matches" : "is compatible with")
        << " requested version \"" << this->Version << "\".\n"
        << "The following configuration files were considered but not "
           "accepted:\n";
      for(std::vector<ConfigFileInfo>::size_type i=0;
          i<this->ConsideredConfigs.size(); i++)
        {
        e << "  " << this->ConsideredConfigs[i].filename
          << ", version: " << this->ConsideredConfigs[i].version << "\n";
        }
      }
    else
      {
      std::string requestedVersionString;
      if(!this->Version.empty())
        {
        requestedVersionString = " (requested version ";
        requestedVersionString += this->Version;
        requestedVersionString += ")";
        }

      if (this->UseConfigFiles)
        {
        if(this->UseFindModules)
          {
          e << "By not providing \"Find" << this->Name << ".cmake\" in "
               "CMAKE_MODULE_PATH this project has asked CMake to find a "
               "package configuration file provided by \""<<this->Name<< "\", "
               "but CMake did not find one.\n";
          }

        if(this->Configs.size() == 1)
          {
          e << "Could not find a package configuration file named \""
            << this->Configs[0] << "\" provided by package \""
            << this->Name << "\"" << requestedVersionString <<".\n";
          }
        else
          {
          e << "Could not find a package configuration file provided by \""
            << this->Name << "\"" << requestedVersionString
            << " with any of the following names:\n"
            << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

        e << "Add the installation prefix of \"" << this->Name << "\" to "
          "CMAKE_PREFIX_PATH or set \"" << this->Variable << "\" to a "
          "directory containing one of the above files. "
          "If \"" << this->Name << "\" provides a separate development "
          "package or SDK, be sure it has been installed.";
        }
      else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
        e << "No \"Find" << this->Name << ".cmake\" found in "
          << "CMAKE_MODULE_PATH.";

        aw<< "Find"<< this->Name <<".cmake must either be part of this "
             "project itself, in this case adjust CMAKE_MODULE_PATH so that "
             "it points to the correct location inside its source tree.\n"
             "Or it must be installed by a package which has already been "
             "found via find_package().  In this case make sure that "
             "package has indeed been found and adjust CMAKE_MODULE_PATH to "
             "contain the location where that package has installed "
             "Find" << this->Name << ".cmake.  This must be a location "
             "provided by that package.  This error in general means that "
             "the buildsystem of this project is relying on a Find-module "
             "without ensuring that it is actually available.\n";
        }
      }


    this->Makefile->IssueMessage(
      this->Required? cmake::FATAL_ERROR : cmake::WARNING, e.str());
    if (this->Required)
      {
      cmSystemTools::SetFatalErrorOccured();
      }

    if (!aw.str().empty())
      {
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,aw.str());
      }
    }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found? "1":"0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if(found)
    {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
    }
  else
    {
    this->Makefile->RemoveDefinition(fileVar);
    }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for(std::vector<ConfigFileInfo>::size_type i=0;
      i<this->ConsideredConfigs.size(); i++)
    {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += this->ConsideredConfigs[i].filename;
    consideredVersions += this->ConsideredConfigs[i].version;
    sep = ";";
    }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}